

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,uint C2)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  uint uStack_30;
  undefined1 auStack_2c [2];
  OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  uint C2_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  layout.R1 = C2;
  layout.C2 = R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>(&uStack_30,R1);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)2>::Assign<unsigned_int>
                        ((uint *)auStack_2c,layout.R1), bVar1)) {
    offsetOfRelativeJumpOffsetFromEnd._6_2_ = 10;
    Data::EncodeT<(Js::LayoutSize)2>
              (&this->m_byteCodeData,op,(void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),10,
               this);
    AddJumpOffset(this,op,labelID,10);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg1Unsigned1(OpCode op, ByteCodeLabel labelID, RegSlot R1, uint C2)
    {
        OpLayoutT_BrReg1Unsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.C2, C2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }